

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HttpHeaders::Header> * __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::operator=
          (ArrayBuilder<kj::HttpHeaders::Header> *this,ArrayBuilder<kj::HttpHeaders::Header> *other)

{
  ArrayBuilder<kj::HttpHeaders::Header> *other_local;
  ArrayBuilder<kj::HttpHeaders::Header> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Header *)0x0;
  other->pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  other->endPtr = (Header *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }